

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O1

lua_State * lua_newstate(lua_Alloc f,void *ud)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  time_t tVar4;
  size_t t;
  lua_State *L;
  uint h;
  char buff [32];
  uint local_4c;
  lua_State *local_48;
  uint *local_40;
  TValue *local_38;
  code *local_30;
  
  L = (lua_State *)0x0;
  pvVar3 = (*f)(ud,(void *)0x0,8,0x670);
  if (pvVar3 != (void *)0x0) {
    L = (lua_State *)((long)pvVar3 + 0x10);
    *(code **)((long)pvVar3 + 0x650) = raviE_default_writeline;
    *(code **)((long)pvVar3 + 0x658) = raviE_default_writestring;
    *(code **)((long)pvVar3 + 0x660) = raviE_default_writestringerror;
    *(undefined8 *)((long)pvVar3 + 0x668) = 0;
    *(undefined8 *)((long)pvVar3 + 0x10) = 0;
    *(undefined2 *)((long)pvVar3 + 0x18) = 0x808;
    *(undefined1 *)((long)pvVar3 + 0x134) = 8;
    *(long *)((long)pvVar3 + 0x28) = (long)pvVar3 + 0xe0;
    *(undefined8 *)((long)pvVar3 + 0x48) = 0;
    *(undefined8 *)((long)pvVar3 + 0x50) = 0;
    *(undefined8 *)((long)pvVar3 + 0x30) = 0;
    *(undefined2 *)((long)pvVar3 + 0xda) = 0;
    *(undefined8 *)((long)pvVar3 + 200) = 0;
    *(lua_State **)((long)pvVar3 + 0x60) = L;
    *(undefined8 *)((long)pvVar3 + 0x68) = 0;
    *(undefined4 *)((long)pvVar3 + 0xd6) = 0x1000000;
    *(undefined8 *)((long)pvVar3 + 0xb8) = 0;
    *(undefined4 *)((long)pvVar3 + 0xd0) = 0;
    *(undefined2 *)((long)pvVar3 + 0xd4) = 1;
    *(undefined1 *)((long)pvVar3 + 0x1a) = 0;
    *(undefined8 *)((long)pvVar3 + 0xc0) = 0;
    *(undefined2 *)((long)pvVar3 + 0xb4) = 0;
    *(undefined1 *)((long)pvVar3 + 0xb7) = 0x2a;
    *(undefined1 *)((long)pvVar3 + 0xdc) = 0x2a;
    *(lua_State **)((long)pvVar3 + 0x140) = L;
    *(undefined8 *)((long)pvVar3 + 0x10) = 0;
    *(lua_Alloc *)((long)pvVar3 + 0xe0) = f;
    *(void **)((long)pvVar3 + 0xe8) = ud;
    *(lua_State **)((long)pvVar3 + 0x1d8) = L;
    tVar4 = time((time_t *)0x0);
    local_40 = &local_4c;
    local_4c = (uint)tVar4;
    local_38 = &luaO_nilobject_;
    local_30 = lua_newstate;
    local_48 = L;
    uVar1 = luaS_hash((char *)&local_48,0x20,local_4c);
    *(uint *)((long)pvVar3 + 0x130) = uVar1;
    *(undefined2 *)((long)pvVar3 + 0x128) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1e0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x110) = 0;
    *(undefined8 *)((long)pvVar3 + 0x118) = 0;
    *(undefined4 *)((long)pvVar3 + 0x135) = 0x14000008;
    *(undefined1 *)((long)pvVar3 + 0x13b) = 0;
    *(undefined8 *)((long)pvVar3 + 0x148) = 0;
    *(undefined8 *)((long)pvVar3 + 0x150) = 0;
    *(undefined8 *)((long)pvVar3 + 0x158) = 0;
    *(undefined8 *)((long)pvVar3 + 0x160) = 0;
    *(undefined8 *)((long)pvVar3 + 0x168) = 0;
    *(undefined8 *)((long)pvVar3 + 0x170) = 0;
    *(undefined8 *)((long)pvVar3 + 0x178) = 0;
    *(undefined8 *)((long)pvVar3 + 0x180) = 0;
    *(undefined8 *)((long)pvVar3 + 0x188) = 0;
    *(undefined8 *)((long)pvVar3 + 400) = 0;
    *(undefined8 *)((long)pvVar3 + 0x198) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1a0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1a8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1b0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1b8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1c0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1c8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1d0) = 0;
    *(undefined8 *)((long)pvVar3 + 0xf0) = 0x670;
    *(undefined8 *)((long)pvVar3 + 0xf8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x108) = 0;
    *(undefined2 *)((long)pvVar3 + 0x13c) = 0x1932;
    *(undefined1 *)((long)pvVar3 + 0x13e) = 0xd;
    *(undefined2 *)((long)pvVar3 + 0x139) = 0x219;
    *(undefined8 *)((long)pvVar3 + 0x2f0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2b0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2b8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2c0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2c8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2d0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2d8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2e0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2e8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x648) = 0;
    raviV_initjit(L);
    iVar2 = luaD_rawrunprotected(L,f_luaopen,(void *)0x0);
    if (iVar2 != 0) {
      close_state(L);
      L = (lua_State *)0x0;
    }
  }
  return L;
}

Assistant:

LUA_API lua_State *lua_newstate (lua_Alloc f, void *ud) {
  int i;
  lua_State *L;
  global_State *g;

  LG *l = cast(LG *, (*f)(ud, NULL, LUA_TTHREAD, sizeof(LG)));
  if (l == NULL) return NULL;
  L = &l->l.l;
  g = &l->g;
  g->ravi_writeline = raviE_default_writeline;
  g->ravi_writestring = raviE_default_writestring;
  g->ravi_writestringerror = raviE_default_writestringerror;
  g->ravi_debugger_data = NULL;
  L->next = NULL;
  L->tt = LUA_TTHREAD;
  g->currentwhite = bitmask(WHITE0BIT);
  L->marked = luaC_white(g);
  preinit_thread(L, g);
  g->allgc = obj2gco(L);  /* by now, only object is the main thread */
  L->next = NULL;
  g->frealloc = f;
  g->ud = ud;
  g->mainthread = L;
  g->seed = makeseed(L);
  g->gcstp = GCSTPGC;  /* no GC while building state */
  g->strt.size = g->strt.nuse = 0;
  g->strt.hash = NULL;
  setnilvalue(&g->l_registry);
  g->panic = NULL;
  g->version = NULL;
  g->gcstate = GCSpause;
  g->gckind = KGC_INC;
  g->gcstopem = 0;
  g->gcemergency = 0;
  g->finobj = g->tobefnz = g->fixedgc = NULL;
  g->firstold1 = g->survival = g->old1 = g->reallyold = NULL;
  g->finobjsur = g->finobjold1 = g->finobjrold = NULL;
  g->sweepgc = NULL;
  g->gray = g->grayagain = NULL;
  g->weak = g->ephemeron = g->allweak = NULL;
  g->twups = NULL;
  g->totalbytes = sizeof(LG);
  g->GCdebt = 0;
  g->lastatomic = 0;
  setgcparam(g->gcpause, LUAI_GCPAUSE);
  setgcparam(g->gcstepmul, LUAI_GCMUL);
  g->gcstepsize = LUAI_GCSTEPSIZE;
  setgcparam(g->genmajormul, LUAI_GENMAJORMUL);
  g->genminormul = LUAI_GENMINORMUL;
  for (i=0; i < LUA_NUMTAGS; i++) g->mt[i] = NULL;
  g->ravi_state = NULL;
  raviV_initjit(L);
  if (luaD_rawrunprotected(L, f_luaopen, NULL) != LUA_OK) {
    /* memory allocation error: free partial state */
    close_state(L);
    L = NULL;
  }
#if RAVI_BYTECODE_PROFILING_ENABLED
  raviV_init_profiledata(L);
#endif
  return L;
}